

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O1

vw_exception * __thiscall VW::vw_exception::operator=(vw_exception *this,vw_exception *other)

{
  if (other != this) {
    this->file = other->file;
    std::__cxx11::string::_M_assign((string *)&this->message);
    this->lineNumber = other->lineNumber;
  }
  return this;
}

Assistant:

vw_exception& vw_exception::operator=(const vw_exception& other)
{
  // check for self-assignment
  if (&other == this)
    return *this;

  file = other.file;
  message = other.message;
  lineNumber = other.lineNumber;

  return *this;
}